

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O1

int IDAAdataStore(IDAMem IDA_mem,IDAckpntMem ck_mem)

{
  IDAadjMemRec *pIVar1;
  IDAdtpntMemRec **ppIVar2;
  IDAdtpntMem pIVar3;
  double dVar4;
  sunrealtype sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  sunrealtype t;
  sunrealtype local_50;
  ulong local_48;
  undefined8 uStack_40;
  
  pIVar1 = IDA_mem->ida_adj_mem;
  ppIVar2 = pIVar1->dt_mem;
  if (ck_mem->ck_next == (IDAckpntMemRec *)0x0) {
    IDASetInitStep(IDA_mem,IDA_mem->ida_h0u);
    iVar8 = IDAReInit(IDA_mem,ck_mem->ck_t0,ck_mem->ck_phi[0],ck_mem->ck_phi[1]);
    if (iVar8 != 0) {
      return -0x69;
    }
    if ((ck_mem->ck_quadr != 0) && (iVar8 = IDAQuadReInit(IDA_mem,ck_mem->ck_phiQ[0]), iVar8 != 0))
    {
      return -0x69;
    }
    if ((ck_mem->ck_sensi != 0) &&
       (iVar8 = IDASensReInit(IDA_mem,IDA_mem->ida_ism,ck_mem->ck_phiS[0],ck_mem->ck_phiS[1]),
       iVar8 != 0)) {
      return -0x69;
    }
    if ((ck_mem->ck_quadr_sensi != 0) &&
       (iVar8 = IDAQuadSensReInit(IDA_mem,ck_mem->ck_phiQS[0]), iVar8 != 0)) {
      return -0x69;
    }
  }
  else {
    IDA_mem->ida_nst = ck_mem->ck_nst;
    IDA_mem->ida_tretlast = ck_mem->ck_tretlast;
    iVar8 = ck_mem->ck_kused;
    iVar6 = ck_mem->ck_knew;
    iVar7 = ck_mem->ck_phase;
    IDA_mem->ida_kk = ck_mem->ck_kk;
    IDA_mem->ida_kused = iVar8;
    IDA_mem->ida_knew = iVar6;
    IDA_mem->ida_phase = iVar7;
    IDA_mem->ida_ns = ck_mem->ck_ns;
    sVar5 = ck_mem->ck_hused;
    IDA_mem->ida_hh = ck_mem->ck_hh;
    IDA_mem->ida_hused = sVar5;
    IDA_mem->ida_eta = ck_mem->ck_eta;
    sVar5 = ck_mem->ck_cjlast;
    IDA_mem->ida_cj = ck_mem->ck_cj;
    IDA_mem->ida_cjlast = sVar5;
    sVar5 = ck_mem->ck_cjratio;
    IDA_mem->ida_cjold = ck_mem->ck_cjold;
    IDA_mem->ida_cjratio = sVar5;
    IDA_mem->ida_tn = ck_mem->ck_t0;
    IDA_mem->ida_ss = ck_mem->ck_ss;
    IDA_mem->ida_ssS = ck_mem->ck_ssS;
    if (0 < ck_mem->ck_phi_alloc) {
      lVar10 = 0;
      do {
        N_VScale(0,ck_mem->ck_phi[lVar10],IDA_mem->ida_phi[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < ck_mem->ck_phi_alloc);
    }
    if ((ck_mem->ck_quadr != 0) && (0 < ck_mem->ck_phi_alloc)) {
      lVar10 = 0;
      do {
        N_VScale(0,ck_mem->ck_phiQ[lVar10],IDA_mem->ida_phiQ[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < ck_mem->ck_phi_alloc);
    }
    if ((ck_mem->ck_sensi != 0) && (0 < IDA_mem->ida_Ns)) {
      lVar10 = 0;
      do {
        if (0 < ck_mem->ck_phi_alloc) {
          lVar9 = 0;
          do {
            N_VScale(0,ck_mem->ck_phiS[lVar9][lVar10],IDA_mem->ida_phiS[lVar9][lVar10]);
            lVar9 = lVar9 + 1;
          } while (lVar9 < ck_mem->ck_phi_alloc);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < IDA_mem->ida_Ns);
    }
    if ((ck_mem->ck_quadr_sensi != 0) && (0 < IDA_mem->ida_Ns)) {
      lVar10 = 0;
      do {
        if (0 < ck_mem->ck_phi_alloc) {
          lVar9 = 0;
          do {
            N_VScale(0,ck_mem->ck_phiQS[lVar9][lVar10],IDA_mem->ida_phiQS[lVar9][lVar10]);
            lVar9 = lVar9 + 1;
          } while (lVar9 < ck_mem->ck_phi_alloc);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < IDA_mem->ida_Ns);
    }
    lVar10 = -0x30;
    do {
      *(undefined8 *)((long)IDA_mem->ida_alpha + lVar10) =
           *(undefined8 *)((long)ck_mem->ck_alpha + lVar10);
      *(undefined8 *)((long)IDA_mem->ida_beta + lVar10) =
           *(undefined8 *)((long)ck_mem->ck_beta + lVar10);
      *(undefined8 *)((long)IDA_mem->ida_sigma + lVar10) =
           *(undefined8 *)((long)ck_mem->ck_sigma + lVar10);
      *(undefined8 *)((long)IDA_mem->ida_gamma + lVar10) =
           *(undefined8 *)((long)ck_mem->ck_gamma + lVar10);
      *(undefined8 *)((long)IDA_mem->ida_gamma + lVar10 + 0x30) =
           *(undefined8 *)((long)ck_mem->ck_gamma + lVar10 + 0x30);
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0);
    IDA_mem->ida_forceSetup = 1;
  }
  pIVar3 = *ppIVar2;
  pIVar3->t = ck_mem->ck_t0;
  (*pIVar1->ia_storePnt)(IDA_mem,pIVar3);
  if (pIVar1->ia_tstopIDAFcall != 0) {
    IDASetStopTime(IDA_mem,pIVar1->ia_tstopIDAF);
  }
  lVar10 = 1;
  local_48 = -(ulong)(pIVar1->ia_tinitial < pIVar1->ia_tfinal);
  uStack_40 = 0;
  do {
    iVar8 = IDASolve(IDA_mem,ck_mem->ck_t1,&local_50,pIVar1->ia_yyTmp,pIVar1->ia_ypTmp,2);
    if (iVar8 < 0) {
      return -0x6a;
    }
    pIVar3 = ppIVar2[lVar10];
    pIVar3->t = local_50;
    (*pIVar1->ia_storePnt)(IDA_mem,pIVar3);
    lVar10 = lVar10 + 1;
    dVar4 = ck_mem->ck_t1 - local_50;
  } while (0.0 < (double)(~local_48 & (ulong)-dVar4 | local_48 & (ulong)dVar4));
  pIVar1->ia_ckpntData = ck_mem;
  pIVar1->ia_newData = 1;
  pIVar1->ia_np = lVar10;
  return 0;
}

Assistant:

static int IDAAdataStore(IDAMem IDA_mem, IDAckpntMem ck_mem)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  sunrealtype t;
  long int i;
  int flag, sign;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  dt_mem     = IDAADJ_mem->dt_mem;

  /* Initialize IDA_mem with data from ck_mem. */
  flag = IDAAckpntGet(IDA_mem, ck_mem);
  if (flag != IDA_SUCCESS) { return (IDA_REIFWD_FAIL); }

  /* Set first structure in dt_mem[0] */
  dt_mem[0]->t = ck_mem->ck_t0;
  IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[0]);

  /* Decide whether TSTOP must be activated */
  if (IDAADJ_mem->ia_tstopIDAFcall)
  {
    IDASetStopTime(IDA_mem, IDAADJ_mem->ia_tstopIDAF);
  }

  sign = (IDAADJ_mem->ia_tfinal - IDAADJ_mem->ia_tinitial > ZERO) ? 1 : -1;

  /* Run IDASolve in IDA_ONE_STEP mode to set following structures in dt_mem[i]. */
  i = 1;
  do {
    flag = IDASolve(IDA_mem, ck_mem->ck_t1, &t, IDAADJ_mem->ia_yyTmp,
                    IDAADJ_mem->ia_ypTmp, IDA_ONE_STEP);
    if (flag < 0) { return (IDA_FWD_FAIL); }

    dt_mem[i]->t = t;
    IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[i]);

    i++;
  }
  while (sign * (ck_mem->ck_t1 - t) > ZERO);

  /* New data is now available. */
  IDAADJ_mem->ia_ckpntData = ck_mem;
  IDAADJ_mem->ia_newData   = SUNTRUE;
  IDAADJ_mem->ia_np        = i;

  return (IDA_SUCCESS);
}